

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void apprun_print_envp(char **envp)

{
  char **local_18;
  char **itr;
  char **envp_local;
  
  fprintf(_stderr,"  envp: [ \n");
  local_18 = envp;
  if (envp != (char **)0x0) {
    for (; *local_18 != (char *)0x0; local_18 = local_18 + 1) {
      fprintf(_stderr,"    \"%s\"",*local_18);
      if (local_18[1] != (char *)0x0) {
        fprintf(_stderr,", \n");
      }
    }
  }
  fprintf(_stderr,"\n  ]\n");
  return;
}

Assistant:

void apprun_print_envp(char *const *envp) {
    fprintf(stderr, "  envp: [ \n");
    if (envp) {
        for (char *const *itr = envp; *itr != 0; itr++) {
            fprintf(stderr, "    \"%s\"", *itr);
            if (*(itr + 1) != NULL)
                fprintf(stderr, ", \n");
        }
    }
    fprintf(stderr, "\n  ]\n");
}